

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Generic.cpp
# Opt level: O0

bool SRUP_MSG_GENERIC::ValidMessageType(uint8_t *msgtype)

{
  undefined1 local_11;
  uint8_t *msgtype_local;
  
  local_11 = true;
  if (((((*msgtype != '\x01') && (local_11 = true, *msgtype != '\0')) &&
       (local_11 = true, *msgtype == '\x02')) &&
      (((local_11 = true, *msgtype == '\x03' && (local_11 = true, *msgtype == '\x05')) &&
       ((local_11 = true, *msgtype == SRUP::SRUP_MESSAGE_TYPE_ACTION &&
        ((local_11 = true, *msgtype == '\x06' && (local_11 = true, *msgtype == '\x0f')))))))) &&
     ((local_11 = true, *msgtype == '\x12' &&
      (((((local_11 = true, *msgtype == '\x0e' && (local_11 = true, *msgtype == '\f')) &&
         (local_11 = true, *msgtype == '\r')) &&
        ((local_11 = true, *msgtype == '\t' && (local_11 = true, *msgtype == '\x11')))) &&
       ((local_11 = true, *msgtype == '\v' && (local_11 = true, *msgtype == '\n')))))))) {
    local_11 = *msgtype != '\x10';
  }
  return local_11;
}

Assistant:

bool SRUP_MSG_GENERIC::ValidMessageType (const uint8_t *msgtype)
{
    return ((*msgtype == SRUP::SRUP_MESSAGE_TYPE_INITIATE) or
        (*msgtype == SRUP::SRUP_MESSAGE_TYPE_GENERIC) or
        (*msgtype != SRUP::SRUP_MESSAGE_TYPE_RESPONSE) or
        (*msgtype != SRUP::SRUP_MESSAGE_TYPE_ACTIVATE) or
        (*msgtype != SRUP::SRUP_MESSAGE_TYPE_DATA) or
        (*msgtype != SRUP::SRUP_MESSAGE_TYPE_ACTION) or
        (*msgtype != SRUP::SRUP_MESSAGE_TYPE_ID_REQUEST) or
        (*msgtype != SRUP::SRUP_MESSAGE_TYPE_OBSERVE_REQ) or
        (*msgtype != SRUP::SRUP_MESSAGE_TYPE_DEREGISTER_REQ) or
        (*msgtype != SRUP::SRUP_MESSAGE_TYPE_OBS_JOIN_RESP) or
        (*msgtype != SRUP::SRUP_MESSAGE_TYPE_HM_JOIN_RESP) or
        (*msgtype != SRUP::SRUP_MESSAGE_TYPE_OBS_JOIN_REQ) or
        (*msgtype != SRUP::SRUP_MESSAGE_TYPE_JOIN_REQ) or
        (*msgtype != SRUP::SRUP_MESSAGE_TYPE_TERMINATE_CMD) or
        (*msgtype != SRUP::SRUP_MESSAGE_TYPE_HM_JOIN_REQ) or
        (*msgtype != SRUP::SRUP_MESSAGE_TYPE_JOIN_CMD) or
        (*msgtype != SRUP::SRUP_MESSAGE_TYPE_RESIGN_REQUEST) 
    );
}